

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O1

void __thiscall ON_NurbsSurface::Dump(ON_NurbsSurface *this,ON_TextLog *dump)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  double *P;
  ulong uVar4;
  char sPreamble [128];
  
  ON_TextLog::Print(dump,
                    "ON_NurbsSurface dim = %d is_rat = %d\n        order = %d X %d cv_count = %d X %d\n"
                    ,(ulong)(uint)this->m_dim,(ulong)(uint)this->m_is_rat,
                    (ulong)(uint)this->m_order[0],(ulong)(uint)this->m_order[1],
                    (ulong)(uint)this->m_cv_count[0],(ulong)(uint)this->m_cv_count[1]);
  uVar4 = 0;
  do {
    uVar1 = ON_KnotCount(this->m_order[uVar4],this->m_cv_count[uVar4]);
    ON_TextLog::Print(dump,"Knot Vector %d ( %d knots )\n",uVar4 & 0xffffffff,(ulong)uVar1);
    ON_TextLog::PrintKnotVector
              (dump,this->m_order[uVar4],this->m_cv_count[uVar4],this->m_knot[uVar4]);
    uVar4 = uVar4 + 1;
  } while (uVar4 == 1);
  pcVar3 = "rational";
  if (this->m_is_rat == 0) {
    pcVar3 = "non-rational";
  }
  ON_TextLog::Print(dump,"Control Points  %d %s points\n  index               value\n",
                    (ulong)(uint)(this->m_cv_count[1] * this->m_cv_count[0]),pcVar3);
  if (this->m_cv != (double *)0x0) {
    sPreamble[0x70] = '\0';
    sPreamble[0x71] = '\0';
    sPreamble[0x72] = '\0';
    sPreamble[0x73] = '\0';
    sPreamble[0x74] = '\0';
    sPreamble[0x75] = '\0';
    sPreamble[0x76] = '\0';
    sPreamble[0x77] = '\0';
    sPreamble[0x78] = '\0';
    sPreamble[0x79] = '\0';
    sPreamble[0x7a] = '\0';
    sPreamble[0x7b] = '\0';
    sPreamble[0x7c] = '\0';
    sPreamble[0x7d] = '\0';
    sPreamble[0x7e] = '\0';
    sPreamble[0x7f] = '\0';
    sPreamble[0x60] = '\0';
    sPreamble[0x61] = '\0';
    sPreamble[0x62] = '\0';
    sPreamble[99] = '\0';
    sPreamble[100] = '\0';
    sPreamble[0x65] = '\0';
    sPreamble[0x66] = '\0';
    sPreamble[0x67] = '\0';
    sPreamble[0x68] = '\0';
    sPreamble[0x69] = '\0';
    sPreamble[0x6a] = '\0';
    sPreamble[0x6b] = '\0';
    sPreamble[0x6c] = '\0';
    sPreamble[0x6d] = '\0';
    sPreamble[0x6e] = '\0';
    sPreamble[0x6f] = '\0';
    sPreamble[0x50] = '\0';
    sPreamble[0x51] = '\0';
    sPreamble[0x52] = '\0';
    sPreamble[0x53] = '\0';
    sPreamble[0x54] = '\0';
    sPreamble[0x55] = '\0';
    sPreamble[0x56] = '\0';
    sPreamble[0x57] = '\0';
    sPreamble[0x58] = '\0';
    sPreamble[0x59] = '\0';
    sPreamble[0x5a] = '\0';
    sPreamble[0x5b] = '\0';
    sPreamble[0x5c] = '\0';
    sPreamble[0x5d] = '\0';
    sPreamble[0x5e] = '\0';
    sPreamble[0x5f] = '\0';
    sPreamble[0x40] = '\0';
    sPreamble[0x41] = '\0';
    sPreamble[0x42] = '\0';
    sPreamble[0x43] = '\0';
    sPreamble[0x44] = '\0';
    sPreamble[0x45] = '\0';
    sPreamble[0x46] = '\0';
    sPreamble[0x47] = '\0';
    sPreamble[0x48] = '\0';
    sPreamble[0x49] = '\0';
    sPreamble[0x4a] = '\0';
    sPreamble[0x4b] = '\0';
    sPreamble[0x4c] = '\0';
    sPreamble[0x4d] = '\0';
    sPreamble[0x4e] = '\0';
    sPreamble[0x4f] = '\0';
    sPreamble[0x30] = '\0';
    sPreamble[0x31] = '\0';
    sPreamble[0x32] = '\0';
    sPreamble[0x33] = '\0';
    sPreamble[0x34] = '\0';
    sPreamble[0x35] = '\0';
    sPreamble[0x36] = '\0';
    sPreamble[0x37] = '\0';
    sPreamble[0x38] = '\0';
    sPreamble[0x39] = '\0';
    sPreamble[0x3a] = '\0';
    sPreamble[0x3b] = '\0';
    sPreamble[0x3c] = '\0';
    sPreamble[0x3d] = '\0';
    sPreamble[0x3e] = '\0';
    sPreamble[0x3f] = '\0';
    sPreamble[0x20] = '\0';
    sPreamble[0x21] = '\0';
    sPreamble[0x22] = '\0';
    sPreamble[0x23] = '\0';
    sPreamble[0x24] = '\0';
    sPreamble[0x25] = '\0';
    sPreamble[0x26] = '\0';
    sPreamble[0x27] = '\0';
    sPreamble[0x28] = '\0';
    sPreamble[0x29] = '\0';
    sPreamble[0x2a] = '\0';
    sPreamble[0x2b] = '\0';
    sPreamble[0x2c] = '\0';
    sPreamble[0x2d] = '\0';
    sPreamble[0x2e] = '\0';
    sPreamble[0x2f] = '\0';
    sPreamble[0x10] = '\0';
    sPreamble[0x11] = '\0';
    sPreamble[0x12] = '\0';
    sPreamble[0x13] = '\0';
    sPreamble[0x14] = '\0';
    sPreamble[0x15] = '\0';
    sPreamble[0x16] = '\0';
    sPreamble[0x17] = '\0';
    sPreamble[0x18] = '\0';
    sPreamble[0x19] = '\0';
    sPreamble[0x1a] = '\0';
    sPreamble[0x1b] = '\0';
    sPreamble[0x1c] = '\0';
    sPreamble[0x1d] = '\0';
    sPreamble[0x1e] = '\0';
    sPreamble[0x1f] = '\0';
    sPreamble[0] = '\0';
    sPreamble[1] = '\0';
    sPreamble[2] = '\0';
    sPreamble[3] = '\0';
    sPreamble[4] = '\0';
    sPreamble[5] = '\0';
    sPreamble[6] = '\0';
    sPreamble[7] = '\0';
    sPreamble[8] = '\0';
    sPreamble[9] = '\0';
    sPreamble[10] = '\0';
    sPreamble[0xb] = '\0';
    sPreamble[0xc] = '\0';
    sPreamble[0xd] = '\0';
    sPreamble[0xe] = '\0';
    sPreamble[0xf] = '\0';
    if (0 < this->m_cv_count[0]) {
      uVar1 = 0;
      do {
        if (uVar1 != 0) {
          ON_TextLog::Print(dump,"\n");
        }
        sPreamble._0_8_ = sPreamble._0_8_ & 0xffffffffffffff00;
        ON_String::FormatIntoBuffer(sPreamble,0x80,"  CV[%2d]",(ulong)uVar1);
        uVar2 = this->m_cv_stride[0] * uVar1;
        P = this->m_cv + uVar2;
        if ((int)uVar2 < 0) {
          P = (double *)0x0;
        }
        if (this->m_cv == (double *)0x0) {
          P = (double *)0x0;
        }
        ON_TextLog::PrintPointList
                  (dump,this->m_dim,this->m_is_rat != 0,this->m_cv_count[1],this->m_cv_stride[1],P,
                   sPreamble);
        uVar1 = uVar1 + 1;
      } while ((int)uVar1 < this->m_cv_count[0]);
    }
    return;
  }
  ON_TextLog::Print(dump,"  nullptr cv array\n");
  return;
}

Assistant:

void ON_NurbsSurface::Dump( ON_TextLog& dump ) const
{
  dump.Print( "ON_NurbsSurface dim = %d is_rat = %d\n"
               "        order = %d X %d cv_count = %d X %d\n",
               m_dim, m_is_rat, m_order[0], m_order[1], m_cv_count[0], m_cv_count[1] );
  int dir;
  for ( dir = 0; dir < 2; dir++ ) 
  {
    dump.Print( "Knot Vector %d ( %d knots )\n", dir, KnotCount(dir) );
    dump.PrintKnotVector( m_order[dir], m_cv_count[dir], m_knot[dir] );
  }

  dump.Print( "Control Points  %d %s points\n"
               "  index               value\n",
               m_cv_count[0]*m_cv_count[1], 
               (m_is_rat) ? "rational" : "non-rational" );
  if ( !m_cv ) 
  {
    dump.Print("  nullptr cv array\n");
  }
  else 
  {
    int i;
    char sPreamble[128] = { 0 };
    const size_t sPremable_capacity = sizeof(sPreamble) / sizeof(sPreamble[0]);
    for ( i = 0; i < m_cv_count[0]; i++ )
    {
      if ( i > 0 )
        dump.Print("\n");
      sPreamble[0] = 0;
      ON_String::FormatIntoBuffer(sPreamble, sPremable_capacity,"  CV[%2d]", i);
      dump.PrintPointList( m_dim, m_is_rat, 
                        m_cv_count[1], m_cv_stride[1],
                        CV(i,0), 
                        sPreamble );
    }
  }
}